

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void __thiscall chatra::Thread::finish(Thread *this)

{
  Node *pNVar1;
  Instance *pIVar2;
  StringId exceptionName;
  Reference ref;
  Class *this_00;
  char *additionalMessage;
  size_type sVar3;
  pointer this_01;
  Requester RVar4;
  Requester RVar5;
  element_type *peVar6;
  InstanceId IVar7;
  reference this_02;
  mapped_type *pmVar8;
  key_type *__x;
  Requester local_98;
  Requester local_90;
  lock_guard<chatra::SpinLock> local_88;
  lock_guard<chatra::SpinLock> lock;
  unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> self;
  Reference parser;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  allocator local_39;
  string local_38;
  reference local_18;
  value_type *f;
  Thread *this_local;
  
  f = (value_type *)this;
  while( true ) {
    local_18 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
    Frame::popAll(local_18);
    if (local_18->exception != (TemporaryObject *)0x0) {
      pNVar1 = local_18->exceptionNode;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,"unhandled exception",&local_39);
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_68);
      errorAtNode(&this->super_IErrorReceiver,Error,pNVar1,&local_38,&local_68);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      ref = TemporaryObject::getRef(local_18->exception);
      this_00 = getReferClass(ref);
      exceptionName = Class::getName(this_00);
      pNVar1 = local_18->exceptionNode;
      additionalMessage = (char *)std::__cxx11::string::data();
      emitError(this,exceptionName,pNVar1,additionalMessage);
      Frame::recycle(local_18,local_18->exception);
      local_18->exception = (TemporaryObject *)0x0;
    }
    if (local_18->caughtException != (TemporaryObject *)0x0) {
      Frame::recycle(local_18,local_18->caughtException);
      local_18->caughtException = (TemporaryObject *)0x0;
    }
    sVar3 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::size(&this->frames);
    if (sVar3 < 3) break;
    popForFinish(this);
  }
  this_01 = std::unique_ptr<chatra::Scope,_std::default_delete<chatra::Scope>_>::operator->
                      (&this->runtime->scope);
  self._M_t.super___uniq_ptr_impl<chatra::Thread,_std::default_delete<chatra::Thread>_>._M_t.
  super__Tuple_impl<0UL,_chatra::Thread_*,_std::default_delete<chatra::Thread>_>.
  super__Head_base<0UL,_chatra::Thread_*,_false>._M_head_impl =
       (__uniq_ptr_data<chatra::Thread,_std::default_delete<chatra::Thread>,_true,_true>)
       Scope::ref(this_01,Parser);
  RVar4 = Reference::lockedBy((Reference *)&self);
  RVar5 = IdType<chatra::Requester,_chatra::Thread>::getId
                    (&this->super_IdType<chatra::Requester,_chatra::Thread>);
  if (RVar4 == RVar5) {
    Reference::unlock((Reference *)&self);
  }
  if ((this->isInteractive & 1U) == 0) {
    this_02 = std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
    Frame::popAll(this_02);
    std::unique_ptr<chatra::Thread,std::default_delete<chatra::Thread>>::
    unique_ptr<std::default_delete<chatra::Thread>,void>
              ((unique_ptr<chatra::Thread,std::default_delete<chatra::Thread>> *)&lock);
    std::lock_guard<chatra::SpinLock>::lock_guard(&local_88,&this->instance->lockThreads);
    pIVar2 = this->instance;
    local_90 = IdType<chatra::Requester,_chatra::Thread>::getId
                         (&this->super_IdType<chatra::Requester,_chatra::Thread>);
    pmVar8 = std::
             unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
             ::operator[](&pIVar2->threads,&local_90);
    std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::operator=
              ((unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> *)&lock,pmVar8);
    pIVar2 = this->instance;
    local_98 = IdType<chatra::Requester,_chatra::Thread>::getId
                         (&this->super_IdType<chatra::Requester,_chatra::Thread>);
    __x = &local_98;
    std::
    unordered_map<chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>,_std::hash<chatra::Requester>,_std::equal_to<chatra::Requester>,_std::allocator<std::pair<const_chatra::Requester,_std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>_>_>_>
    ::erase(&pIVar2->threads,__x);
    std::lock_guard<chatra::SpinLock>::~lock_guard(&local_88);
    IdType<chatra::Requester,_chatra::Thread>::remove
              (&this->super_IdType<chatra::Requester,_chatra::Thread>,(char *)__x);
    checkTransferReq(this);
    std::unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_>::~unique_ptr
              ((unique_ptr<chatra::Thread,_std::default_delete<chatra::Thread>_> *)&lock);
  }
  else {
    checkTransferReq(this);
    std::atomic<bool>::operator=(&this->readyToNextInteraction,true);
    peVar6 = std::__shared_ptr_access<chatra::IHost,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chatra::IHost,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->runtime->host);
    IVar7 = IdType<chatra::InstanceId,_chatra::Instance>::getId
                      (&this->instance->super_IdType<chatra::InstanceId,_chatra::Instance>);
    (*peVar6->_vptr_IHost[5])(peVar6,IVar7);
  }
  return;
}

Assistant:

void Thread::finish() {
	for (;;) {
		auto& f = frames.back();
		f.popAll();

		if (f.exception != nullptr) {
			errorAtNode(*this, ErrorLevel::Error, f.exceptionNode, "unhandled exception", {});
			emitError(getReferClass(f.exception->getRef())->getName(), f.exceptionNode, f.stackTrace.data());

			f.recycle(f.exception);
			f.exception = nullptr;
		}

		if (f.caughtException != nullptr) {
			f.recycle(f.caughtException);
			f.caughtException = nullptr;
		}

		if (frames.size() <= residentialFrameCount)
			break;

		popForFinish();
	}

	auto parser = runtime.scope->ref(StringId::Parser);
	if (parser.lockedBy() == getId())
		parser.unlock();

	if (isInteractive) {
		checkTransferReq();
		readyToNextInteraction = true;
		runtime.host->onInteractiveInstanceReady(instance.getId());
		return;
	}

	// Remove returned value and exceptions
	frames.back().popAll();

	std::unique_ptr<Thread> self;
	{
		std::lock_guard<SpinLock> lock(instance.lockThreads);
		self = std::move(instance.threads[getId()]);
		instance.threads.erase(getId());
	}
	remove();
	checkTransferReq();
	chatra_assert(transferReq.empty());
}